

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SupportVectorRegressor::MergeFrom
          (SupportVectorRegressor *this,SupportVectorRegressor *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  Kernel *this_00;
  Coefficients *this_01;
  SparseSupportVectors *this_02;
  DenseSupportVectors *this_03;
  Kernel *from_00;
  Coefficients *from_01;
  SparseSupportVectors *from_02;
  DenseSupportVectors *from_03;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/SVM.pb.cc"
               ,0xc7b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->kernel_;
  if (from_00 != (Kernel *)0x0 &&
      from != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    this_00 = this->kernel_;
    if (this_00 == (Kernel *)0x0) {
      this_00 = (Kernel *)operator_new(0x20);
      Kernel::Kernel(this_00);
      this->kernel_ = this_00;
      from_00 = from->kernel_;
    }
    if (from_00 == (Kernel *)0x0) {
      from_00 = (Kernel *)&_Kernel_default_instance_;
    }
    Kernel::MergeFrom(this_00,from_00);
  }
  from_01 = from->coefficients_;
  if (from_01 != (Coefficients *)0x0 &&
      from != (SupportVectorRegressor *)&_SupportVectorRegressor_default_instance_) {
    this_01 = this->coefficients_;
    if (this_01 == (Coefficients *)0x0) {
      this_01 = (Coefficients *)operator_new(0x28);
      Coefficients::Coefficients(this_01);
      this->coefficients_ = this_01;
      from_01 = from->coefficients_;
    }
    if (from_01 == (Coefficients *)0x0) {
      from_01 = (Coefficients *)&_Coefficients_default_instance_;
    }
    Coefficients::MergeFrom(this_01,from_01);
  }
  dVar1 = from->rho_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->rho_ = dVar1;
  }
  if (from->_oneof_case_[0] != 3) {
    if (from->_oneof_case_[0] != 2) {
      return;
    }
    if (this->_oneof_case_[0] == 2) {
      this_02 = (this->supportVectors_).sparsesupportvectors_;
    }
    else {
      clear_supportVectors(this);
      this->_oneof_case_[0] = 2;
      this_02 = (SparseSupportVectors *)operator_new(0x30);
      SparseSupportVectors::SparseSupportVectors(this_02);
      (this->supportVectors_).sparsesupportvectors_ = this_02;
      if (from->_oneof_case_[0] != 2) {
        protobuf_SVM_2eproto::InitDefaults();
        from_02 = (SparseSupportVectors *)&_SparseSupportVectors_default_instance_;
        goto LAB_0024d921;
      }
    }
    from_02 = (from->supportVectors_).sparsesupportvectors_;
LAB_0024d921:
    SparseSupportVectors::MergeFrom(this_02,from_02);
    return;
  }
  if (this->_oneof_case_[0] == 3) {
    this_03 = (this->supportVectors_).densesupportvectors_;
  }
  else {
    clear_supportVectors(this);
    this->_oneof_case_[0] = 3;
    this_03 = (DenseSupportVectors *)operator_new(0x30);
    DenseSupportVectors::DenseSupportVectors(this_03);
    (this->supportVectors_).densesupportvectors_ = this_03;
    if (from->_oneof_case_[0] != 3) {
      protobuf_SVM_2eproto::InitDefaults();
      from_03 = (DenseSupportVectors *)&_DenseSupportVectors_default_instance_;
      goto LAB_0024d937;
    }
  }
  from_03 = (from->supportVectors_).densesupportvectors_;
LAB_0024d937:
  DenseSupportVectors::MergeFrom(this_03,from_03);
  return;
}

Assistant:

void SupportVectorRegressor::MergeFrom(const SupportVectorRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SupportVectorRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_kernel()) {
    mutable_kernel()->::CoreML::Specification::Kernel::MergeFrom(from.kernel());
  }
  if (from.has_coefficients()) {
    mutable_coefficients()->::CoreML::Specification::Coefficients::MergeFrom(from.coefficients());
  }
  if (from.rho() != 0) {
    set_rho(from.rho());
  }
  switch (from.supportVectors_case()) {
    case kSparseSupportVectors: {
      mutable_sparsesupportvectors()->::CoreML::Specification::SparseSupportVectors::MergeFrom(from.sparsesupportvectors());
      break;
    }
    case kDenseSupportVectors: {
      mutable_densesupportvectors()->::CoreML::Specification::DenseSupportVectors::MergeFrom(from.densesupportvectors());
      break;
    }
    case SUPPORTVECTORS_NOT_SET: {
      break;
    }
  }
}